

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O2

int write_code(char *s,char *t)

{
  char cVar1;
  id *piVar2;
  included *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  FILE *pFVar7;
  FILE *pFVar8;
  long lVar9;
  Fl_Type *pFVar10;
  char cVar11;
  char *pcVar12;
  Fl_Type *p;
  char *pcVar13;
  Fl_Type *pFVar14;
  char define_name [102];
  
  piVar2 = id_root;
  pcVar13 = "wb";
  if (write_sourceview == 0) {
    pcVar13 = "w";
  }
  write_number = write_number + 1;
  if (id_root != (id *)0x0) {
    id::~id(id_root);
  }
  operator_delete(piVar2,0x20);
  id_root = (id *)0x0;
  indentation = 0;
  current_class = (Fl_Class_Type *)0x0;
  current_widget_class = (Fl_Widget_Class_Type *)0x0;
  pFVar7 = _stdout;
  if ((s == (char *)0x0) || (pFVar7 = fl_fopen(s,pcVar13), pFVar7 != (FILE *)0x0)) {
    pFVar8 = _stdout;
    code_file = pFVar7;
    if ((t == (char *)0x0) || (pFVar8 = fl_fopen(t,pcVar13), pFVar8 != (FILE *)0x0)) {
      pFVar10 = Fl_Type::first;
      header_file = pFVar8;
      if (Fl_Type::first == (Fl_Type *)0x0) {
        pFVar10 = (Fl_Type *)0x0;
      }
      else {
        iVar4 = (*Fl_Type::first->_vptr_Fl_Type[0x25])(Fl_Type::first);
        if (iVar4 != 0) {
          if (write_sourceview != 0) {
            lVar9 = ftell((FILE *)code_file);
            pFVar10->code_position = (int)lVar9;
            lVar9 = ftell((FILE *)header_file);
            pFVar10->header_position = (int)lVar9;
          }
          (*pFVar10->_vptr_Fl_Type[0x11])(pFVar10);
          if (write_sourceview != 0) {
            lVar9 = ftell((FILE *)code_file);
            pFVar10->code_position_end = (int)lVar9;
            lVar9 = ftell((FILE *)header_file);
            pFVar10->header_position_end = (int)lVar9;
          }
          pFVar10 = pFVar10->next;
        }
      }
      fprintf((FILE *)header_file,
              "// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n",
              0x3ff07c84b5dcc63f);
      fprintf((FILE *)code_file,
              "// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n",
              0x3ff07c84b5dcc63f);
      pcVar13 = fl_filename_name(t);
      iVar4 = isalpha((int)*pcVar13);
      if (iVar4 == 0) {
        pcVar12 = define_name + 1;
        define_name[0] = '_';
      }
      else {
        pcVar12 = define_name;
      }
      lVar9 = 0;
      while( true ) {
        cVar1 = pcVar13[lVar9];
        if (cVar1 == '\0') break;
        iVar4 = isalnum((int)cVar1);
        cVar11 = '_';
        if (iVar4 != 0) {
          cVar11 = cVar1;
        }
        pcVar12[lVar9] = cVar11;
        lVar9 = lVar9 + 1;
      }
      pcVar12[lVar9] = '\0';
      fprintf((FILE *)header_file,"#ifndef %s\n",define_name);
      fprintf((FILE *)header_file,"#define %s\n",define_name);
      write_declare("#include <FL/Fl.H>");
      if ((i18n_type != 0) && (cVar1 = *i18n_include, cVar1 != '\0')) {
        if ((cVar1 == '<') || (cVar1 == '\"')) {
          pcVar13 = "#include %s\n";
        }
        else {
          pcVar13 = "#include \"%s\"\n";
        }
        write_c(pcVar13);
        if (i18n_type == 2) {
          if (*i18n_file == '\0') {
            write_c("// Initialize I18N stuff now for menus...\n");
            write_c("#include <locale.h>\n");
            write_c("static char *_locale = setlocale(LC_MESSAGES, \"\");\n");
            pcVar12 = "static nl_catd _catalog = catopen(\"%s\", 0);\n";
            pcVar13 = i18n_program;
          }
          else {
            pcVar12 = "extern nl_catd %s;\n";
            pcVar13 = i18n_file;
          }
          write_c(pcVar12,pcVar13);
        }
      }
      if ((t != (char *)0x0) && (include_H_from_C != 0)) {
        if ((*header_file_name == '.') &&
           (pcVar13 = strchr(header_file_name,0x2f), pcVar13 == (char *)0x0)) {
          t = fl_filename_name(t);
        }
        write_c("#include \"%s\"\n",t);
      }
      for (; piVar3 = included_root, pFVar10 != (Fl_Type *)0x0; pFVar10 = write_code(pFVar10)) {
        if (write_sourceview != 0) {
          lVar9 = ftell((FILE *)header_file);
          pFVar10->header_position = (int)lVar9;
        }
        (*pFVar10->_vptr_Fl_Type[0x10])(pFVar10);
        pFVar14 = pFVar10;
        if (write_sourceview != 0) {
          lVar9 = ftell((FILE *)header_file);
          iVar4 = (int)lVar9;
          if (pFVar10->header_position == (int)lVar9) {
            iVar4 = -1;
          }
          pFVar10->header_position_end = iVar4;
        }
        while ((pFVar14 = pFVar14->next, pFVar14 != (Fl_Type *)0x0 &&
               (pFVar10->level < pFVar14->level))) {
          if (write_sourceview != 0) {
            lVar9 = ftell((FILE *)header_file);
            pFVar14->header_position = (int)lVar9;
          }
          (*pFVar14->_vptr_Fl_Type[0x10])(pFVar14);
          if (write_sourceview != 0) {
            lVar9 = ftell((FILE *)header_file);
            iVar4 = (int)lVar9;
            if (pFVar14->header_position == (int)lVar9) {
              iVar4 = -1;
            }
            pFVar14->header_position_end = iVar4;
          }
        }
      }
      if (included_root != (included *)0x0) {
        included::~included(included_root);
      }
      operator_delete(piVar3,0x18);
      included_root = (included *)0x0;
      if (s != (char *)0x0) {
        fwrite("#endif\n",7,1,(FILE *)header_file);
        pFVar10 = Fl_Type::last;
        if ((Fl_Type::last != (Fl_Type *)0x0) &&
           (iVar4 = (*Fl_Type::last->_vptr_Fl_Type[0x25])(Fl_Type::last), iVar4 != 0)) {
          if (write_sourceview != 0) {
            lVar9 = ftell((FILE *)code_file);
            pFVar10->code_position = (int)lVar9;
            lVar9 = ftell((FILE *)header_file);
            pFVar10->header_position = (int)lVar9;
          }
          (*pFVar10->_vptr_Fl_Type[0x11])(pFVar10);
          if (write_sourceview != 0) {
            lVar9 = ftell((FILE *)code_file);
            pFVar10->code_position_end = (int)lVar9;
            lVar9 = ftell((FILE *)header_file);
            pFVar10->header_position_end = (int)lVar9;
          }
        }
        uVar5 = fclose((FILE *)code_file);
        code_file = (FILE *)0x0;
        uVar6 = fclose((FILE *)header_file);
        header_file = (FILE *)0x0;
        return ~(uVar6 | uVar5) >> 0x1f;
      }
      included_root = (included *)0x0;
      return 1;
    }
    fclose((FILE *)code_file);
  }
  return 0;
}

Assistant:

int write_code(const char *s, const char *t) {
  const char *filemode = "w";
  if (write_sourceview) 
    filemode = "wb";
  write_number++;
  delete id_root; id_root = 0;
  indentation = 0;
  current_class = 0L;
  current_widget_class = 0L;
  if (!s) code_file = stdout;
  else {
    FILE *f = fl_fopen(s, filemode);
    if (!f) return 0;
    code_file = f;
  }
  if (!t) header_file = stdout;
  else {
    FILE *f = fl_fopen(t, filemode);
    if (!f) {fclose(code_file); return 0;}
    header_file = f;
  }
  // if the first entry in the Type tree is a comment, then it is probably 
  // a copyright notice. We print that before anything else in the file!
  Fl_Type* first_type = Fl_Type::first;
  if (first_type && first_type->is_comment()) {
    if (write_sourceview) {
      first_type->code_position = (int)ftell(code_file);
      first_type->header_position = (int)ftell(header_file);
    }
    // it is ok to write non-recusive code here, because comments have no children or code2 blocks
    first_type->write_code1();
    if (write_sourceview) {
      first_type->code_position_end = (int)ftell(code_file);
      first_type->header_position_end = (int)ftell(header_file);
    }
    first_type = first_type->next;
  }

  const char *hdr = "\
// generated by Fast Light User Interface Designer (fluid) version %.4f\n\n";
  fprintf(header_file, hdr, FL_VERSION);
  fprintf(code_file, hdr, FL_VERSION);

  {char define_name[102];
  const char* a = fl_filename_name(t);
  char* b = define_name;
  if (!isalpha(*a)) {*b++ = '_';}
  while (*a) {*b++ = isalnum(*a) ? *a : '_'; a++;}
  *b = 0;
  fprintf(header_file, "#ifndef %s\n", define_name);
  fprintf(header_file, "#define %s\n", define_name);
  }  

  write_declare("#include <FL/Fl.H>");
  if (i18n_type && i18n_include[0]) {
    if (i18n_include[0] != '<' &&
        i18n_include[0] != '\"')
      write_c("#include \"%s\"\n", i18n_include);
    else
      write_c("#include %s\n", i18n_include);
    if (i18n_type == 2) {
      if (i18n_file[0]) write_c("extern nl_catd %s;\n", i18n_file);
      else {
        write_c("// Initialize I18N stuff now for menus...\n");
        write_c("#include <locale.h>\n");
	write_c("static char *_locale = setlocale(LC_MESSAGES, \"\");\n");
        write_c("static nl_catd _catalog = catopen(\"%s\", 0);\n",
                   i18n_program);
      }
    }
  }
  if (t && include_H_from_C) {
    if (*header_file_name == '.' && strchr(header_file_name, '/') == NULL) {
      write_c("#include \"%s\"\n", fl_filename_name(t));
    } else {
      write_c("#include \"%s\"\n", t);
    }
  }
  for (Fl_Type* p = first_type; p;) {
    // write all static data for this & all children first
    if (write_sourceview) p->header_position = (int)ftell(header_file);
    p->write_static();
    if (write_sourceview) {
      p->header_position_end = (int)ftell(header_file);
      if (p->header_position==p->header_position_end) p->header_position_end = -1;
    }
    for (Fl_Type* q = p->next; q && q->level > p->level; q = q->next) {
      if (write_sourceview) q->header_position = (int)ftell(header_file);
      q->write_static();
      if (write_sourceview) {
        q->header_position_end = (int)ftell(header_file);
        if (q->header_position==q->header_position_end) q->header_position_end = -1;
      }
    }
    // then write the nested code:
    p = write_code(p);
  }

  delete included_root; included_root = 0;

  if (!s) return 1;

  fprintf(header_file, "#endif\n");

  Fl_Type* last_type = Fl_Type::last;
  if (last_type && last_type->is_comment()) {
    if (write_sourceview) {
      last_type->code_position = (int)ftell(code_file);
      last_type->header_position = (int)ftell(header_file);
    }
    last_type->write_code1();
    if (write_sourceview) {
      last_type->code_position_end = (int)ftell(code_file);
      last_type->header_position_end = (int)ftell(header_file);
    }
  }

  int x = fclose(code_file);
  code_file = 0;
  int y = fclose(header_file);
  header_file = 0;
  return x >= 0 && y >= 0;
}